

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

TypeDenoter * __thiscall Parser::parseTypeDenoter(Parser *this)

{
  FILE *__stream;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  string *__str;
  TypeDenoter *this_00;
  TokenType type_00;
  string local_70;
  string type;
  
  __str = Token::getValue_abi_cxx11_(this->currentToken);
  std::__cxx11::string::string((string *)&type,__str);
  bVar1 = std::operator==(&type,"int");
  bVar2 = std::operator==(&type,"double");
  bVar3 = std::operator==(&type,"float");
  bVar4 = std::operator==(&type,"long");
  bVar5 = std::operator==(&type,"String");
  bVar6 = std::operator==(&type,"char");
  if ((((!bVar6) && (!bVar5)) && (!bVar4)) && (((!bVar3 && (!bVar1)) && (!bVar2)))) {
    fprintf(_stderr,"\nFATAL: Unknown data type \'%s\' is not defined!",type._M_dataplus._M_p);
    exit(1);
  }
  loadNextToken(this);
  __stream = _stdout;
  Token::tokenDesc_abi_cxx11_(&local_70,(Token *)0x0,type_00);
  fprintf(__stream,"\x1b[32m\tParsing [Type (%s) ] \'%s\'\n\x1b[0m",local_70._M_dataplus._M_p,
          type._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = (TypeDenoter *)operator_new(0x28);
  Scanner::toUpper(&local_70,&type);
  TypeDenoter::TypeDenoter(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&type);
  return this_00;
}

Assistant:

TypeDenoter *Parser::parseTypeDenoter() {
    std::string type = currentToken->getValue();

    bool verified = false;

#ifdef _INT
    if (type == "int") {
        verified = true;
    }
#endif
#ifdef _DOUBLE
    if (type == "double") {
        verified = true;
    }
#endif
#ifdef _FLOAT
    if (type == "float") {
        verified = true;
    }
#endif
#ifdef _LONG
    if (type == "long") {
        verified = true;
    }
#endif
#ifdef _STRING
    if (type == "String") {
        verified = true;
    }
#endif
#ifdef _CHAR
    if (type == "char") {
        verified = true;
    }
#endif

    if (verified) {
        // Prep next token
        loadNextToken();

        // Debug output
        if (_VERBOSITY >= 3) {
            fprintf(stdout, ANSI_COLOR_GREEN "\tParsing [Type (%s) ] \'%s\'\n" ANSI_COLOR_RESET,
                    Token::tokenDesc(TokenType::IdentifierToken).data(), type.data());
        }

        return new TypeDenoter(Scanner::toUpper(type));
    }

    fprintf(stderr, "\nFATAL: Unknown data type \'%s\' is not defined!", type.data());
    exit(1);
}